

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O0

int __thiscall MatroskaDemuxer::readTrackEncoding(MatroskaDemuxer *this,MatroskaTrack *track)

{
  int local_34;
  uint32_t local_28;
  int local_24;
  uint32_t id;
  int res;
  MatroskaTrack *track_local;
  MatroskaDemuxer *this_local;
  
  _id = track;
  track_local = (MatroskaTrack *)this;
  local_24 = ebml_read_master(this,&local_28);
  this_local._4_4_ = local_24;
  if (-1 < local_24) {
    do {
      if ((local_24 != 0) || (local_28 = ebml_peek_id(this,&this->level_up), local_28 == 0))
      goto LAB_002cab43;
      if (0 < this->level_up) {
        this->level_up = this->level_up + -1;
        goto LAB_002cab43;
      }
      if (local_28 == 0x5034) {
        local_34 = readEncodingCompression(this,_id);
      }
      else {
        local_34 = ebml_read_skip(this);
      }
      local_24 = local_34;
    } while (this->level_up == 0);
    this->level_up = this->level_up + -1;
LAB_002cab43:
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int MatroskaDemuxer::readTrackEncoding(MatroskaTrack *track)
{
    int res;
    uint32_t id;

    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&level_up)) == 0)
        {
            break;
        }
        if (level_up > 0)
        {
            level_up--;
            break;
        }

        res = id == MATROSKA_ID_ENCODINGCOMPRESSION ? readEncodingCompression(track) : ebml_read_skip();

        if (level_up)
        {
            level_up--;
            break;
        }
    }
    return 0;
}